

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_sub_8_er_pi(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar2 = m68ki_cpu.ir;
  addr_in = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = addr_in + 1;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  uVar5 = (ulong)(uVar2 >> 7 & 0x1c);
  uVar3 = m68k_read_memory_8(addr_in & m68ki_cpu.address_mask);
  uVar1 = *(uint *)((long)m68ki_cpu.dar + uVar5);
  uVar4 = uVar1 & 0xff;
  m68ki_cpu.x_flag = uVar4 - uVar3;
  m68ki_cpu.v_flag = (uVar4 ^ m68ki_cpu.x_flag) & (uVar3 ^ uVar4);
  m68ki_cpu.not_z_flag = m68ki_cpu.x_flag & 0xff;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *(uint *)((long)m68ki_cpu.dar + uVar5) = uVar1 & 0xffffff00 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_sub_8_er_pi(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AY_PI_8();
	uint dst = MASK_OUT_ABOVE_8(*r_dst);
	uint res = dst - src;

	FLAG_N = NFLAG_8(res);
	FLAG_X = FLAG_C = CFLAG_8(res);
	FLAG_V = VFLAG_SUB_8(src, dst, res);
	FLAG_Z = MASK_OUT_ABOVE_8(res);

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | FLAG_Z;
}